

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::MakeNamedMedium
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  int iVar1;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  ParameterDictionary local_e8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  local_128._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&local_128);
  ParameterDictionary::ParameterDictionary(&local_e8,&local_80,RGBColorSpace::sRGB);
  local_80.nStored = 0;
  (*(local_80.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_80.alloc.memoryResource,local_80.ptr,local_80.nAlloc << 3,8);
  if (this->upgrade == true) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_128,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc
                );
      ParameterDictionary::ToParameterList_abi_cxx11_
                (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
      Printf<std::__cxx11::string,char_const(&)[12],std::__cxx11::string>
                ("%sMakeNamedMedium \"%s\"\n%s\n",&local_128,(char (*) [12])"uniformgrid",&local_108
                );
      goto LAB_0055efad;
    }
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_128,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_108,&local_e8,*(int *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string>
            ("%sMakeNamedMedium \"%s\"\n%s\n",&local_128,name,&local_108);
LAB_0055efad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_e8.params.nStored = 0;
  (*(local_e8.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_e8.params.alloc.memoryResource,local_e8.params.ptr,local_e8.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::MakeNamedMedium(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade && name == "heterogeneous")
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), "uniformgrid",
               dict.ToParameterList(catIndentCount));
    else
        Printf("%sMakeNamedMedium \"%s\"\n%s\n", indent(), name,
               dict.ToParameterList(catIndentCount));
}